

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O3

ByteData * __thiscall
cfd::core::Privkey::SignMessage
          (ByteData *__return_storage_ptr__,Privkey *this,string *message,string *message_magic)

{
  ByteData256 hash;
  ByteData256 local_30;
  
  HashMessage(&local_30,message,message_magic);
  SignatureUtil::CalculateEcSignature(__return_storage_ptr__,&local_30,this,false,true);
  if (local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_30.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData Privkey::SignMessage(
    const std::string &message, const std::string &message_magic) const {
  ByteData256 hash = HashMessage(message, message_magic);
  return SignatureUtil::CalculateEcSignature(hash, *this, false, true);
}